

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.h
# Opt level: O2

void __thiscall xLearn::Trainer::SaveModel(Trainer *this,string *filename)

{
  int iVar1;
  ostream *poVar2;
  allocator local_56;
  allocator local_55;
  Logger local_54;
  string local_50;
  string local_30;
  
  if (filename->_M_string_length == 0) {
    local_54.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/trainer.h"
               ,&local_55);
    std::__cxx11::string::string((string *)&local_50,"SaveModel",&local_56);
    poVar2 = Logger::Start(ERR,&local_30,0x4f,&local_50);
    poVar2 = std::operator<<(poVar2,"CHECK_NE failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/trainer.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x4f);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"filename.empty()");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"true");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::operator<<(poVar2,"\n");
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)filename);
    if (iVar1 != 0) {
      Model::Serialize(this->model_,filename);
      return;
    }
    local_54.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/trainer.h"
               ,&local_55);
    std::__cxx11::string::string((string *)&local_50,"SaveModel",&local_56);
    poVar2 = Logger::Start(ERR,&local_30,0x50,&local_50);
    poVar2 = std::operator<<(poVar2,"CHECK_NE failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/trainer.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x50);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"filename.compare(\"none\")");
    poVar2 = std::operator<<(poVar2," = ");
    iVar1 = std::__cxx11::string::compare((char *)filename);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"0");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
    std::operator<<(poVar2,"\n");
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  Logger::~Logger(&local_54);
  abort();
}

Assistant:

void SaveModel(const std::string& filename) {
    CHECK_NE(filename.empty(), true);
    CHECK_NE(filename.compare("none"), 0);
    model_->Serialize(filename);
  }